

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfo.cpp
# Opt level: O0

void __thiscall Memory::HeapInfo::FlushBackgroundPages(HeapInfo *this)

{
  HeapInfo *this_local;
  
  ForEachPageAllocator<Memory::HeapInfo::FlushBackgroundPages()::__0>(this);
  return;
}

Assistant:

void
HeapInfo::FlushBackgroundPages()
{
    ForEachPageAllocator([](IdleDecommitPageAllocator * pageAlloc)
    {
        pageAlloc->SuspendIdleDecommit();
        pageAlloc->FlushBackgroundPages();
        pageAlloc->ResumeIdleDecommit();
    });
}